

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prepared-c.cpp
# Opt level: O2

duckdb_logical_type
duckdb_param_logical_type(duckdb_prepared_statement prepared_statement,idx_t param_idx)

{
  bool bVar1;
  __type _Var2;
  pointer pPVar3;
  PreparedStatementData *this;
  LogicalType *this_00;
  iterator iVar4;
  LogicalType param_type;
  string identifier;
  
  if ((prepared_statement != (duckdb_prepared_statement)0x0) &&
     (*(long *)(prepared_statement + 0x38) != 0)) {
    pPVar3 = duckdb::
             unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>,_true>
             ::operator->((unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>,_true>
                           *)(prepared_statement + 0x38));
    bVar1 = duckdb::PreparedStatement::HasError(pPVar3);
    if (!bVar1) {
      duckdb_parameter_name_internal_abi_cxx11_(&identifier,prepared_statement,param_idx);
      param_type._0_8_ =
           &param_type.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
      param_type.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      param_type.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_1_
           = 0;
      _Var2 = std::operator==(&identifier,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &param_type);
      std::__cxx11::string::~string((string *)&param_type);
      if (_Var2) {
        this_00 = (LogicalType *)0x0;
      }
      else {
        duckdb::LogicalType::LogicalType(&param_type);
        pPVar3 = duckdb::
                 unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>,_true>
                 ::operator->((unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>,_true>
                               *)(prepared_statement + 0x38));
        this = duckdb::shared_ptr<duckdb::PreparedStatementData,_true>::operator->(&pPVar3->data);
        bVar1 = duckdb::PreparedStatementData::TryGetType(this,&identifier,&param_type);
        if (bVar1) {
          this_00 = (LogicalType *)operator_new(0x18);
          duckdb::LogicalType::LogicalType(this_00,&param_type);
        }
        else {
          iVar4 = std::
                  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                          *)prepared_statement,&identifier);
          if (iVar4.
              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>,_true>
              ._M_cur == (__node_type *)0x0) {
            this_00 = (LogicalType *)0x0;
          }
          else {
            this_00 = (LogicalType *)operator_new(0x18);
            duckdb::LogicalType::LogicalType
                      (this_00,(LogicalType *)
                               ((long)iVar4.
                                      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>,_true>
                                      ._M_cur + 0x68));
          }
        }
        duckdb::LogicalType::~LogicalType(&param_type);
      }
      std::__cxx11::string::~string((string *)&identifier);
      return (duckdb_logical_type)this_00;
    }
  }
  return (duckdb_logical_type)0x0;
}

Assistant:

duckdb_logical_type duckdb_param_logical_type(duckdb_prepared_statement prepared_statement, idx_t param_idx) {
	auto wrapper = reinterpret_cast<PreparedStatementWrapper *>(prepared_statement);
	if (!wrapper || !wrapper->statement || wrapper->statement->HasError()) {
		return nullptr;
	}

	auto identifier = duckdb_parameter_name_internal(prepared_statement, param_idx);
	if (identifier == duckdb::string()) {
		return nullptr;
	}

	LogicalType param_type;

	if (wrapper->statement->data->TryGetType(identifier, param_type)) {
		return reinterpret_cast<duckdb_logical_type>(new LogicalType(param_type));
	}
	// The value_map is gone after executing the prepared statement
	// See if this is the case and we still have a value registered for it
	auto it = wrapper->values.find(identifier);
	if (it != wrapper->values.end()) {
		return reinterpret_cast<duckdb_logical_type>(new LogicalType(it->second.return_type));
	}
	return nullptr;
}